

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O3

int gotofile(char *fpth)

{
  uint uVar1;
  int *doto;
  mgwin *pmVar2;
  int iVar3;
  buffer *pbVar4;
  int iVar5;
  int iVar6;
  line *plVar7;
  bool bVar8;
  char local_448 [8];
  char fname [1024];
  int local_34;
  
  xbasename(local_448,fpth,0x400);
  pbVar4 = curbp;
  fname._1016_8_ = curbp->b_headp;
  plVar7 = ((line *)fname._1016_8_)->l_fp;
  if (plVar7 == (line *)fname._1016_8_) {
    iVar6 = 0;
  }
  else {
    iVar5 = 0;
    do {
      iVar6 = iVar5 + 1;
      uVar1 = plVar7->l_used;
      doto = (int *)plVar7->l_text;
      d_warpdot((line *)(ulong)uVar1,doto);
      if (((0 < (long)local_34) && (doto != (int *)0x0)) &&
         (iVar3 = strcmp(local_448,(char *)((long)local_34 + (long)doto)), pmVar2 = curwp,
         iVar3 == 0)) {
        curwp->w_dotp = plVar7;
        pmVar2->w_dotline = iVar6;
        d_warpdot((line *)(ulong)uVar1,doto);
        pbVar4 = curbp;
        iVar6 = iVar5;
        break;
      }
      plVar7 = plVar7->l_fp;
      iVar5 = iVar6;
    } while (plVar7 != (line *)fname._1016_8_);
  }
  bVar8 = iVar6 != pbVar4->b_lines + -1;
  if (bVar8) {
    eerase();
  }
  else {
    ewprintf("File not found %s",local_448);
  }
  return (uint)bVar8;
}

Assistant:

int
gotofile(char *fpth)
{
	struct line	*lp, *nlp;
	char		 fname[NFILEN];
	char		*p;
	int		 tmp;

	(void)xbasename(fname, fpth, NFILEN);
	tmp = 0;
	for (lp = bfirstlp(curbp); lp != curbp->b_headp; lp = nlp) {
		tmp++;
		if ((p = findfname(lp, p)) == NULL) {
			nlp = lforw(lp);
			continue;
		}
		if (strcmp(fname, p) == 0) {
			curwp->w_dotp = lp;
			curwp->w_dotline = tmp;
			(void)d_warpdot(curwp->w_dotp, &curwp->w_doto);
			tmp--;
			break;
		}
		nlp = lforw(lp);
	}
	if (tmp == curbp->b_lines - 1) {
		ewprintf("File not found %s", fname);
		return (FALSE);
	} else {
		eerase();
		return (TRUE);
	}
}